

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relay.cpp
# Opt level: O1

void __thiscall TCPRelayHandler::HandleEvent(TCPRelayHandler *this,SOCKET s,int event)

{
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if (this->remote_socket_ == s) {
    if ((event & 8U) != 0) {
      OnRemoteError(this);
    }
    if (((event & 0x11U) != 0) && (this->stage_ != -1)) {
      OnRemoteRead(this);
    }
    if (((event & 4U) != 0) && (this->stage_ != -1)) {
      OnRemoteWrite(this);
    }
  }
  else if (this->local_socket_ == s) {
    if ((event & 8U) != 0) {
      OnLocalError(this);
    }
    if (((event & 0x11U) != 0) && (this->stage_ != -1)) {
      OnLocalRead(this);
    }
    if (((event & 4U) != 0) && (this->stage_ != -1)) {
      OnLocalWrite(this);
    }
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,local_30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [warning] ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"unknown socket\n",0xf)
    ;
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  if (this->stage_ == -1) {
    (*(this->super_IDNSNotify)._vptr_IDNSNotify[1])(this);
  }
  return;
}

Assistant:

void TCPRelayHandler::HandleEvent(SOCKET s, int event)
{
    // order is important
    if (s == remote_socket_)
    {
        if (event & kPollErr)
        {
            OnRemoteError();
        }
        if (!IsDestroyed() &&
                (event & (kPollIn | kPollHup)))
        {
            OnRemoteRead();
        }
        if (!IsDestroyed() && (event & kPollOut))
        {
            OnRemoteWrite();
        }
    }
    else if (s == local_socket_)
    {
        if (event & kPollErr)
        {
            OnLocalError();
        }
        if (!IsDestroyed() &&
                (event & (kPollIn | kPollHup)))
        {
            OnLocalRead();
        }
        if (!IsDestroyed() && (event & kPollOut))
        {
            OnLocalWrite();
        }
    }
    else
        LOGW << "unknown socket\n";
    if (IsDestroyed())
    {
        //free memory when it mark destroyed
        delete this;
    }
}